

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_long,_short,_15>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *lhs,short *rhs,short *result)

{
  short sVar1;
  short sVar2;
  uint32_t uVar3;
  ulong uVar4;
  short *in_RDX;
  short *in_RSI;
  ulong *in_RDI;
  uint64_t tmp_1;
  uint64_t tmp;
  
  if (*in_RSI < 0) {
    uVar4 = *in_RDI;
    uVar3 = AbsValueHelper<short,_0>::Abs(0);
    uVar4 = uVar4 + uVar3;
    if ((uVar4 < *in_RDI) || (sVar1 = std::numeric_limits<short>::max(), (ulong)(long)sVar1 < uVar4)
       ) {
LAB_0018f89f:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *in_RDX = (short)uVar4;
  }
  else if (*in_RDI < (ulong)(long)*in_RSI) {
    *in_RDX = (short)*in_RDI - *in_RSI;
  }
  else {
    uVar4 = *in_RDI;
    sVar1 = *in_RSI;
    sVar2 = std::numeric_limits<short>::max();
    if ((ulong)(long)sVar2 < uVar4 - (long)sVar1) goto LAB_0018f89f;
    *in_RDX = (short)(uVar4 - (long)sVar1);
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // U is std::uint64_t, T is signed
        if( rhs < 0 )
        {
            // treat this as addition
            std::uint64_t tmp = 0;

            tmp = lhs + (std::uint64_t)AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( rhs );

            // must check for addition overflow and max
            if( tmp >= lhs && tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }
        else if( (std::uint64_t)rhs > lhs ) // now both are positive, so comparison always works
        {
            // result is negative
            // implies that lhs must fit into T, and result cannot overflow
            // Also allows us to drop to 32-bit math, which is faster on a 32-bit system
            result = (T)lhs - (T)rhs;
            return;
        }
        else
        {
            // result is positive
            std::uint64_t tmp = (std::uint64_t)lhs - (std::uint64_t)rhs;

            if( tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }